

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int wherePathSolver(WhereInfo *pWInfo,LogEst nRowEst)

{
  undefined8 *puVar1;
  char cVar2;
  Parse *pPVar3;
  ulong uVar4;
  ulong uVar5;
  WhereLoop **ppWVar6;
  SrcList *pSVar7;
  ExprList *pOrderBy;
  byte bVar8;
  i8 iVar9;
  LogEst LVar10;
  ushort uVar11;
  short sVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int extraout_EAX;
  WherePath *pWVar17;
  undefined6 extraout_var;
  undefined6 extraout_var_00;
  bool bVar18;
  short sVar19;
  LogEst *pLVar20;
  undefined4 uVar22;
  WhereLoop ***pppWVar23;
  LogEst *pLVar24;
  long lVar25;
  WherePath *pWVar26;
  undefined6 in_register_00000032;
  WherePath *pWVar27;
  ulong uVar28;
  short sVar29;
  ulong uVar30;
  WhereLoop *pWVar31;
  uint uVar32;
  ushort *puVar33;
  Bitmask revMask;
  Bitmask local_d8;
  ulong local_d0;
  ulong local_c8;
  uint local_c0;
  uint local_bc;
  ulong local_b8;
  WhereLoop **local_b0;
  LogEst *local_a8;
  int local_a0;
  uint local_9c;
  undefined8 local_98;
  WhereInfo *local_90;
  WherePath *local_88;
  Parse *local_80;
  WherePath *local_78;
  uint local_6c;
  undefined4 local_68;
  int local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  WherePath *local_50;
  ushort *local_48;
  LogEst *local_40;
  size_t local_38;
  WhereLoop **ppWVar21;
  
  local_98 = CONCAT62(in_register_00000032,nRowEst);
  pPVar3 = pWInfo->pParse;
  bVar8 = pWInfo->nLevel;
  puVar33 = (ushort *)(ulong)bVar8;
  uVar32 = (uint)bVar8;
  local_b8 = 1;
  if (1 < uVar32) {
    local_b8 = (ulong)((uint)(uVar32 != 2) * 5 + 5);
  }
  local_c0 = 0;
  if (nRowEst != 0 && pWInfo->pOrderBy != (ExprList *)0x0) {
    local_c0 = pWInfo->pOrderBy->nExpr;
  }
  uVar16 = (uint)local_b8;
  lVar25 = (long)(int)local_c0;
  local_50 = (WherePath *)
             sqlite3DbMallocRawNN
                       (pPVar3->db,
                        (long)(int)((int)(lVar25 * 2) + ((uint)bVar8 * 8 + 0x20) * uVar16 * 2));
  if (local_50 == (WherePath *)0x0) {
    return 0;
  }
  uVar28 = (ulong)(uVar16 << 5);
  pWVar26 = (WherePath *)((long)&local_50->maskLoop + uVar28);
  puVar1 = (undefined8 *)((long)&local_50->nRow + uVar28);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1 = (undefined8 *)((long)&local_50->maskLoop + uVar28);
  *puVar1 = 0;
  puVar1[1] = 0;
  local_b0 = (WhereLoop **)((long)&pWVar26->maskLoop + uVar28);
  iVar13 = uVar16 * 2 + 1;
  pppWVar23 = &local_50->aLoop;
  do {
    *pppWVar23 = local_b0;
    iVar13 = iVar13 + -1;
    local_b0 = (WhereLoop **)((long)local_b0 + (ulong)((uint)bVar8 * 8));
    pppWVar23 = pppWVar23 + 4;
  } while (1 < iVar13);
  if (local_c0 == 0) {
    local_b0 = (WhereLoop **)0x0;
  }
  else {
    memset(local_b0,0,lVar25 * 2);
    uVar16 = (uint)local_b8;
  }
  pLVar20 = (LogEst *)0x30;
  if (pPVar3->nQueryLoop < 0x30) {
    pLVar20 = (LogEst *)(ulong)pPVar3->nQueryLoop;
  }
  pWVar26->nRow = (LogEst)pLVar20;
  pLVar24 = (LogEst *)(ulong)local_c0;
  if (local_c0 != 0) {
    pLVar20 = (LogEst *)(ulong)-uVar32;
    pWVar26->isOrdered = -(uVar32 != 0) | (byte)local_c0;
  }
  local_80 = pPVar3;
  if (puVar33 == (ushort *)0x0) {
    uVar32 = 1;
  }
  else {
    local_6c = (int)local_98 - 10;
    local_64 = (int)local_98 + -0x32;
    pLVar20 = (LogEst *)0x2;
    if (2 < uVar16) {
      pLVar20 = (LogEst *)(ulong)uVar16;
    }
    uVar32 = 1;
    local_a8 = (LogEst *)0x0;
    uVar30 = 0;
    uVar16 = 0;
    uVar28 = 0;
    local_60 = (uint)pLVar20;
    pWVar17 = local_50;
    local_90 = pWInfo;
    local_78 = pWVar26;
    local_48 = puVar33;
    do {
      local_88 = pWVar17;
      if ((int)uVar32 < 1) {
        uVar32 = 0;
      }
      else {
        local_38 = (long)local_a8 * 8;
        local_40 = &pWVar17[1].rUnsorted;
        local_9c = 0;
        local_5c = (uint)local_a8 & 0xffff;
        pLVar24 = (LogEst *)0x0;
        pLVar20 = local_a8;
        pWVar26 = local_78;
        local_58 = uVar32;
        do {
          for (pWVar31 = pWInfo->pLoops; uVar32 = (uint)pLVar24, pWVar31 != (WhereLoop *)0x0;
              pWVar31 = pWVar31->pNextLoop) {
            uVar4 = pWVar26->maskLoop;
            if ((((pWVar31->prereq & ~uVar4) == 0) &&
                (uVar5 = pWVar31->maskSelf, (uVar5 & uVar4) == 0)) &&
               (((pWVar31->wsFlags & 0x4000) == 0 || (2 < pWVar26->nRow)))) {
              sVar29 = pWVar26->nRow;
              local_d0 = uVar28;
              local_c8 = uVar30;
              LVar10 = sqlite3LogEstAdd(pWVar31->rSetup,pWVar31->rRun + sVar29);
              LVar10 = sqlite3LogEstAdd(LVar10,pWVar26->rUnsorted);
              iVar13 = (int)CONCAT62(extraout_var,LVar10);
              local_bc = (uint)(ushort)(sVar29 + pWVar31->nOut);
              bVar8 = pWVar26->isOrdered;
              if ((char)bVar8 < '\0') {
                local_d8 = 0;
                bVar8 = wherePathSatisfiesOrderBy
                                  (local_90,local_90->pOrderBy,pWVar26,local_90->wctrlFlags,
                                   (u16)local_5c,pWVar31,&local_d8);
              }
              else {
                local_d8 = pWVar26->revLoop;
              }
              iVar14 = local_c0 - (int)(char)bVar8;
              bVar18 = (iVar14 == 0 || (int)local_c0 < (int)(char)bVar8) || (char)bVar8 < '\0';
              ppWVar21 = (WhereLoop **)(ulong)CONCAT31((char)bVar8 >> 7,bVar18);
              if (bVar18) {
                sVar29 = LVar10 + -2;
              }
              else {
                uVar28 = (ulong)bVar8;
                local_54 = uVar32;
                if (*(short *)((long)local_b0 + uVar28 * 2) == 0) {
                  local_a0 = iVar13;
                  LVar10 = sqlite3LogEst((long)((iVar14 * 100) / (int)local_c0));
                  uVar22 = (undefined4)CONCAT62(extraout_var_00,LVar10);
                  uVar32._0_2_ = local_90->wctrlFlags;
                  uVar32._2_2_ = local_90->iLimit;
                  if (((uVar32 >> 0xe & 1) == 0) ||
                     (uVar15 = (uint)(ushort)local_90->iLimit, (short)local_98 <= local_90->iLimit))
                  {
                    uVar15 = (uint)local_98;
                    if ((uVar32 & 0x100) != 0) {
                      uVar15 = local_6c;
                    }
                    if ((short)local_98 < 0xb) {
                      uVar15 = (uint)local_98;
                    }
                  }
                  if ((short)uVar15 < 0xb) {
                    sVar29 = 0;
                  }
                  else {
                    local_68 = uVar22;
                    LVar10 = sqlite3LogEst((ulong)(uVar15 & 0xffff));
                    sVar29 = LVar10 + -0x21;
                    uVar22 = local_68;
                  }
                  *(short *)((long)local_b0 + uVar28 * 2) = sVar29 + (short)local_64 + (short)uVar22
                  ;
                  iVar13 = local_a0;
                }
                sVar29 = (short)iVar13;
                ppWVar21 = local_b0;
                uVar11 = sqlite3LogEstAdd(sVar29,*(LogEst *)((long)local_b0 + uVar28 * 2));
                iVar13 = uVar11 + 5;
                pLVar24 = (LogEst *)(ulong)local_54;
              }
              sVar12 = (short)iVar13;
              if ((local_a8 == (LogEst *)0x0) && ((pWVar31->wsFlags & 0x2000000) != 0)) {
                sVar12 = sVar12 + -10;
                local_bc = local_bc - 0x1e;
              }
              uVar32 = (uint)pLVar24;
              pLVar20 = (LogEst *)CONCAT71((int7)((ulong)ppWVar21 >> 8),0 < (int)uVar32);
              sVar19 = (short)local_bc;
              iVar13 = (int)local_b8;
              uVar28 = local_d0;
              uVar30 = local_c8;
              if (0 < (int)uVar32) {
                pWVar17 = local_88;
                uVar15 = 1;
                do {
                  if ((pWVar17->maskLoop == (uVar5 | uVar4)) &&
                     (-1 < (char)(pWVar17->isOrdered ^ bVar8))) {
                    if ((char)pLVar20 != '\0') {
                      if (pWVar17->rCost < sVar12) goto LAB_0019d4e4;
                      if (pWVar17->rCost != sVar12) goto LAB_0019d40a;
                      pLVar20 = (LogEst *)(ulong)local_bc;
                      if ((pWVar17->nRow < sVar19) ||
                         ((pWVar17->nRow == sVar19 && (pWVar17->rUnsorted <= sVar29))))
                      goto LAB_0019d4e4;
                      goto LAB_0019d40a;
                    }
                    break;
                  }
                  pWVar17 = pWVar17 + 1;
                  pLVar20 = (LogEst *)
                            CONCAT71((int7)((ulong)pLVar20 >> 8),(int)uVar15 < (int)uVar32);
                  bVar18 = uVar15 != uVar32;
                  uVar15 = uVar15 + 1;
                } while (bVar18);
              }
              uVar15 = uVar32;
              if (iVar13 <= (int)uVar32) {
                pLVar20 = pLVar24;
                if ((short)local_c8 < sVar12) goto LAB_0019d4e4;
                uVar15 = uVar16;
                if (sVar12 == (short)local_c8) {
                  pLVar20 = (LogEst *)(ulong)uVar16;
                  if ((short)local_d0 <= sVar29) goto LAB_0019d4e4;
                }
              }
              pLVar24 = (LogEst *)(ulong)(uVar32 + ((int)uVar32 < iVar13));
              pWVar17 = local_88 + (int)uVar15;
LAB_0019d40a:
              pWVar17->maskLoop = pWVar31->maskSelf | pWVar26->maskLoop;
              pWVar17->revLoop = local_d8;
              pWVar17->nRow = sVar19;
              pWVar17->rCost = sVar12;
              pWVar17->rUnsorted = sVar29;
              pWVar17->isOrdered = bVar8;
              memcpy(pWVar17->aLoop,pWVar26->aLoop,local_38);
              pWVar17->aLoop[(long)local_a8] = pWVar31;
              pLVar20 = local_a8;
              uVar28 = local_d0;
              uVar30 = local_c8;
              if (iVar13 <= (int)pLVar24) {
                uVar16 = 0;
                uVar28 = (ulong)(ushort)local_88->nRow;
                uVar30 = (ulong)(ushort)local_88->rCost;
                if (1 < (byte)local_48) {
                  uVar16 = 0;
                  uVar32 = 1;
                  pLVar20 = local_40;
                  do {
                    uVar11 = pLVar20[-1];
                    if (((short)(ushort)uVar30 < (short)uVar11) ||
                       ((uVar11 == (ushort)uVar30 && ((short)uVar28 < *pLVar20)))) {
                      uVar28 = (ulong)(ushort)*pLVar20;
                      uVar30 = (ulong)uVar11;
                      uVar16 = uVar32;
                    }
                    uVar32 = uVar32 + 1;
                    pLVar20 = pLVar20 + 0x10;
                  } while (local_60 != uVar32);
                }
              }
            }
LAB_0019d4e4:
          }
          local_9c = local_9c + 1;
          pWVar26 = pWVar26 + 1;
          pWInfo = local_90;
        } while (local_9c != local_58);
      }
      pWVar17 = local_78;
      pLVar24 = (LogEst *)((long)local_a8 + 1);
      local_78 = local_88;
      pWVar26 = local_88;
      puVar33 = local_48;
      local_a8 = pLVar24;
    } while ((ushort *)pLVar24 != local_48);
  }
  pPVar3 = local_80;
  if (uVar32 == 0) {
    sqlite3ErrorMsg(local_80,"no query solution",pLVar24,pLVar20);
  }
  else {
    if (1 < (int)uVar32) {
      lVar25 = (ulong)uVar32 - 1;
      pWVar27 = pWVar26;
      pWVar17 = pWVar26;
      do {
        pWVar26 = pWVar17 + 1;
        if (pWVar27->rCost <= pWVar17[1].rCost) {
          pWVar26 = pWVar27;
        }
        lVar25 = lVar25 + -1;
        pWVar27 = pWVar26;
        pWVar17 = pWVar17 + 1;
      } while (lVar25 != 0);
    }
    if (puVar33 != (ushort *)0x0) {
      ppWVar6 = pWVar26->aLoop;
      pSVar7 = pWInfo->pTabList;
      ppWVar21 = &pWInfo->a[0].pWLoop;
      uVar28 = 0;
      do {
        pWVar31 = ppWVar6[uVar28];
        *ppWVar21 = pWVar31;
        bVar8 = pWVar31->iTab;
        *(byte *)(ppWVar21 + -4) = bVar8;
        *(int *)((long)ppWVar21 + -0x5c) = pSVar7->a[bVar8].iCursor;
        uVar28 = uVar28 + 1;
        ppWVar21 = ppWVar21 + 0xe;
      } while (((ulong)puVar33 & 0xffffffff) != uVar28);
    }
    if (((((pWInfo->wctrlFlags & 0x180) == 0x100) && ((short)local_98 != 0)) &&
        (pWInfo->eDistinct == '\0')) &&
       (iVar9 = wherePathSatisfiesOrderBy
                          (pWInfo,pWInfo->pResultSet,pWVar26,0x80,(short)puVar33 - 1,
                           pWVar26->aLoop[(long)puVar33 + -1],&local_d8),
       pWInfo->pResultSet->nExpr == (int)iVar9)) {
      pWInfo->eDistinct = '\x02';
    }
    bVar8 = pWInfo->field_0x44;
    pWInfo->field_0x44 = bVar8 & 0xfb;
    pOrderBy = pWInfo->pOrderBy;
    if (pOrderBy != (ExprList *)0x0) {
      cVar2 = pWVar26->isOrdered;
      pWInfo->nOBSat = cVar2;
      if ((char)pWInfo->wctrlFlags < '\0') {
        if (pOrderBy->nExpr == (int)cVar2) {
          pWInfo->eDistinct = '\x02';
        }
      }
      else {
        pWInfo->revMask = pWVar26->revLoop;
        if (cVar2 < '\x01') {
          pWInfo->nOBSat = '\0';
          if (puVar33 != (ushort *)0x0) {
            uVar16 = (int)puVar33 - 1;
            uVar32 = pWVar26->aLoop[uVar16]->wsFlags;
            if ((~uVar32 & 0x104) != 0 && (uVar32 >> 0xc & 1) == 0) {
              local_d8 = 0;
              iVar9 = wherePathSatisfiesOrderBy
                                (pWInfo,pOrderBy,pWVar26,0x800,(u16)uVar16,pWVar26->aLoop[uVar16],
                                 &local_d8);
              if (pWInfo->pOrderBy->nExpr == (int)iVar9) {
                pWInfo->field_0x44 = pWInfo->field_0x44 | 4;
                pWInfo->revMask = local_d8;
              }
            }
          }
        }
        else if (((pWInfo->wctrlFlags & 3) != 0 && puVar33 != (ushort *)0x0) && cVar2 == '\x01') {
          pWInfo->field_0x44 = bVar8 | 4;
        }
      }
      if ((((pWInfo->wctrlFlags & 0x200) != 0) && (puVar33 != (ushort *)0x0)) &&
         (pWInfo->pOrderBy->nExpr == (int)pWInfo->nOBSat)) {
        local_d8 = 0;
        uVar32 = (int)puVar33 - 1;
        iVar9 = wherePathSatisfiesOrderBy
                          (pWInfo,pWInfo->pOrderBy,pWVar26,0,(u16)uVar32,pWVar26->aLoop[uVar32],
                           &local_d8);
        if (pWInfo->pOrderBy->nExpr == (int)iVar9) {
          pWInfo->field_0x44 = pWInfo->field_0x44 | 8;
          pWInfo->revMask = local_d8;
        }
      }
    }
    pWInfo->nRowOut = pWVar26->nRow;
  }
  sqlite3DbFreeNN(pPVar3->db,local_50);
  return extraout_EAX;
}

Assistant:

static int wherePathSolver(WhereInfo *pWInfo, LogEst nRowEst){
  int mxChoice;             /* Maximum number of simultaneous paths tracked */
  int nLoop;                /* Number of terms in the join */
  Parse *pParse;            /* Parsing context */
  int iLoop;                /* Loop counter over the terms of the join */
  int ii, jj;               /* Loop counters */
  int mxI = 0;              /* Index of next entry to replace */
  int nOrderBy;             /* Number of ORDER BY clause terms */
  LogEst mxCost = 0;        /* Maximum cost of a set of paths */
  LogEst mxUnsorted = 0;    /* Maximum unsorted cost of a set of path */
  int nTo, nFrom;           /* Number of valid entries in aTo[] and aFrom[] */
  WherePath *aFrom;         /* All nFrom paths at the previous level */
  WherePath *aTo;           /* The nTo best paths at the current level */
  WherePath *pFrom;         /* An element of aFrom[] that we are working on */
  WherePath *pTo;           /* An element of aTo[] that we are working on */
  WhereLoop *pWLoop;        /* One of the WhereLoop objects */
  WhereLoop **pX;           /* Used to divy up the pSpace memory */
  LogEst *aSortCost = 0;    /* Sorting and partial sorting costs */
  char *pSpace;             /* Temporary memory used by this routine */
  int nSpace;               /* Bytes of space allocated at pSpace */

  pParse = pWInfo->pParse;
  nLoop = pWInfo->nLevel;
  /* TUNING: For simple queries, only the best path is tracked.
  ** For 2-way joins, the 5 best paths are followed.
  ** For joins of 3 or more tables, track the 10 best paths */
  mxChoice = (nLoop<=1) ? 1 : (nLoop==2 ? 5 : 10);
  assert( nLoop<=pWInfo->pTabList->nSrc );
  WHERETRACE(0x002, ("---- begin solver.  (nRowEst=%d)\n", nRowEst));

  /* If nRowEst is zero and there is an ORDER BY clause, ignore it. In this
  ** case the purpose of this call is to estimate the number of rows returned
  ** by the overall query. Once this estimate has been obtained, the caller
  ** will invoke this function a second time, passing the estimate as the
  ** nRowEst parameter.  */
  if( pWInfo->pOrderBy==0 || nRowEst==0 ){
    nOrderBy = 0;
  }else{
    nOrderBy = pWInfo->pOrderBy->nExpr;
  }

  /* Allocate and initialize space for aTo, aFrom and aSortCost[] */
  nSpace = (sizeof(WherePath)+sizeof(WhereLoop*)*nLoop)*mxChoice*2;
  nSpace += sizeof(LogEst) * nOrderBy;
  pSpace = sqlite3StackAllocRawNN(pParse->db, nSpace);
  if( pSpace==0 ) return SQLITE_NOMEM_BKPT;
  aTo = (WherePath*)pSpace;
  aFrom = aTo+mxChoice;
  memset(aFrom, 0, sizeof(aFrom[0]));
  pX = (WhereLoop**)(aFrom+mxChoice);
  for(ii=mxChoice*2, pFrom=aTo; ii>0; ii--, pFrom++, pX += nLoop){
    pFrom->aLoop = pX;
  }
  if( nOrderBy ){
    /* If there is an ORDER BY clause and it is not being ignored, set up
    ** space for the aSortCost[] array. Each element of the aSortCost array
    ** is either zero - meaning it has not yet been initialized - or the
    ** cost of sorting nRowEst rows of data where the first X terms of
    ** the ORDER BY clause are already in order, where X is the array
    ** index.  */
    aSortCost = (LogEst*)pX;
    memset(aSortCost, 0, sizeof(LogEst) * nOrderBy);
  }
  assert( aSortCost==0 || &pSpace[nSpace]==(char*)&aSortCost[nOrderBy] );
  assert( aSortCost!=0 || &pSpace[nSpace]==(char*)pX );

  /* Seed the search with a single WherePath containing zero WhereLoops.
  **
  ** TUNING: Do not let the number of iterations go above 28.  If the cost
  ** of computing an automatic index is not paid back within the first 28
  ** rows, then do not use the automatic index. */
  aFrom[0].nRow = MIN(pParse->nQueryLoop, 48);  assert( 48==sqlite3LogEst(28) );
  nFrom = 1;
  assert( aFrom[0].isOrdered==0 );
  if( nOrderBy ){
    /* If nLoop is zero, then there are no FROM terms in the query. Since
    ** in this case the query may return a maximum of one row, the results
    ** are already in the requested order. Set isOrdered to nOrderBy to
    ** indicate this. Or, if nLoop is greater than zero, set isOrdered to
    ** -1, indicating that the result set may or may not be ordered,
    ** depending on the loops added to the current plan.  */
    aFrom[0].isOrdered = nLoop>0 ? -1 : nOrderBy;
  }

  /* Compute successively longer WherePaths using the previous generation
  ** of WherePaths as the basis for the next.  Keep track of the mxChoice
  ** best paths at each generation */
  for(iLoop=0; iLoop<nLoop; iLoop++){
    nTo = 0;
    for(ii=0, pFrom=aFrom; ii<nFrom; ii++, pFrom++){
      for(pWLoop=pWInfo->pLoops; pWLoop; pWLoop=pWLoop->pNextLoop){
        LogEst nOut;                      /* Rows visited by (pFrom+pWLoop) */
        LogEst rCost;                     /* Cost of path (pFrom+pWLoop) */
        LogEst rUnsorted;                 /* Unsorted cost of (pFrom+pWLoop) */
        i8 isOrdered;                     /* isOrdered for (pFrom+pWLoop) */
        Bitmask maskNew;                  /* Mask of src visited by (..) */
        Bitmask revMask;                  /* Mask of rev-order loops for (..) */

        if( (pWLoop->prereq & ~pFrom->maskLoop)!=0 ) continue;
        if( (pWLoop->maskSelf & pFrom->maskLoop)!=0 ) continue;
        if( (pWLoop->wsFlags & WHERE_AUTO_INDEX)!=0 && pFrom->nRow<3 ){
          /* Do not use an automatic index if the this loop is expected
          ** to run less than 1.25 times.  It is tempting to also exclude
          ** automatic index usage on an outer loop, but sometimes an automatic
          ** index is useful in the outer loop of a correlated subquery. */
          assert( 10==sqlite3LogEst(2) );
          continue;
        }

        /* At this point, pWLoop is a candidate to be the next loop.
        ** Compute its cost */
        rUnsorted = sqlite3LogEstAdd(pWLoop->rSetup,pWLoop->rRun + pFrom->nRow);
        rUnsorted = sqlite3LogEstAdd(rUnsorted, pFrom->rUnsorted);
        nOut = pFrom->nRow + pWLoop->nOut;
        maskNew = pFrom->maskLoop | pWLoop->maskSelf;
        isOrdered = pFrom->isOrdered;
        if( isOrdered<0 ){
          revMask = 0;
          isOrdered = wherePathSatisfiesOrderBy(pWInfo,
                       pWInfo->pOrderBy, pFrom, pWInfo->wctrlFlags,
                       iLoop, pWLoop, &revMask);
        }else{
          revMask = pFrom->revLoop;
        }
        if( isOrdered>=0 && isOrdered<nOrderBy ){
          if( aSortCost[isOrdered]==0 ){
            aSortCost[isOrdered] = whereSortingCost(
                pWInfo, nRowEst, nOrderBy, isOrdered
            );
          }
          /* TUNING:  Add a small extra penalty (5) to sorting as an
          ** extra encouragment to the query planner to select a plan
          ** where the rows emerge in the correct order without any sorting
          ** required. */
          rCost = sqlite3LogEstAdd(rUnsorted, aSortCost[isOrdered]) + 5;

          WHERETRACE(0x002,
              ("---- sort cost=%-3d (%d/%d) increases cost %3d to %-3d\n",
               aSortCost[isOrdered], (nOrderBy-isOrdered), nOrderBy,
               rUnsorted, rCost));
        }else{
          rCost = rUnsorted;
          rUnsorted -= 2;  /* TUNING:  Slight bias in favor of no-sort plans */
        }

        /* TUNING:  A full-scan of a VIEW or subquery in the outer loop
        ** is not so bad. */
        if( iLoop==0 && (pWLoop->wsFlags & WHERE_VIEWSCAN)!=0 ){
          rCost += -10;
          nOut += -30;
        }

        /* Check to see if pWLoop should be added to the set of
        ** mxChoice best-so-far paths.
        **
        ** First look for an existing path among best-so-far paths
        ** that covers the same set of loops and has the same isOrdered
        ** setting as the current path candidate.
        **
        ** The term "((pTo->isOrdered^isOrdered)&0x80)==0" is equivalent
        ** to (pTo->isOrdered==(-1))==(isOrdered==(-1))" for the range
        ** of legal values for isOrdered, -1..64.
        */
        for(jj=0, pTo=aTo; jj<nTo; jj++, pTo++){
          if( pTo->maskLoop==maskNew
           && ((pTo->isOrdered^isOrdered)&0x80)==0
          ){
            testcase( jj==nTo-1 );
            break;
          }
        }
        if( jj>=nTo ){
          /* None of the existing best-so-far paths match the candidate. */
          if( nTo>=mxChoice
           && (rCost>mxCost || (rCost==mxCost && rUnsorted>=mxUnsorted))
          ){
            /* The current candidate is no better than any of the mxChoice
            ** paths currently in the best-so-far buffer.  So discard
            ** this candidate as not viable. */
#ifdef WHERETRACE_ENABLED /* 0x4 */
            if( sqlite3WhereTrace&0x4 ){
              sqlite3DebugPrintf("Skip   %s cost=%-3d,%3d,%3d order=%c\n",
                  wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                  isOrdered>=0 ? isOrdered+'0' : '?');
            }
#endif
            continue;
          }
          /* If we reach this points it means that the new candidate path
          ** needs to be added to the set of best-so-far paths. */
          if( nTo<mxChoice ){
            /* Increase the size of the aTo set by one */
            jj = nTo++;
          }else{
            /* New path replaces the prior worst to keep count below mxChoice */
            jj = mxI;
          }
          pTo = &aTo[jj];
#ifdef WHERETRACE_ENABLED /* 0x4 */
          if( sqlite3WhereTrace&0x4 ){
            sqlite3DebugPrintf("New    %s cost=%-3d,%3d,%3d order=%c\n",
                wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                isOrdered>=0 ? isOrdered+'0' : '?');
          }
#endif
        }else{
          /* Control reaches here if best-so-far path pTo=aTo[jj] covers the
          ** same set of loops and has the same isOrdered setting as the
          ** candidate path.  Check to see if the candidate should replace
          ** pTo or if the candidate should be skipped.
          **
          ** The conditional is an expanded vector comparison equivalent to:
          **   (pTo->rCost,pTo->nRow,pTo->rUnsorted) <= (rCost,nOut,rUnsorted)
          */
          if( pTo->rCost<rCost
           || (pTo->rCost==rCost
               && (pTo->nRow<nOut
                   || (pTo->nRow==nOut && pTo->rUnsorted<=rUnsorted)
                  )
              )
          ){
#ifdef WHERETRACE_ENABLED /* 0x4 */
            if( sqlite3WhereTrace&0x4 ){
              sqlite3DebugPrintf(
                  "Skip   %s cost=%-3d,%3d,%3d order=%c",
                  wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                  isOrdered>=0 ? isOrdered+'0' : '?');
              sqlite3DebugPrintf("   vs %s cost=%-3d,%3d,%3d order=%c\n",
                  wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
                  pTo->rUnsorted, pTo->isOrdered>=0 ? pTo->isOrdered+'0' : '?');
            }
#endif
            /* Discard the candidate path from further consideration */
            testcase( pTo->rCost==rCost );
            continue;
          }
          testcase( pTo->rCost==rCost+1 );
          /* Control reaches here if the candidate path is better than the
          ** pTo path.  Replace pTo with the candidate. */
#ifdef WHERETRACE_ENABLED /* 0x4 */
          if( sqlite3WhereTrace&0x4 ){
            sqlite3DebugPrintf(
                "Update %s cost=%-3d,%3d,%3d order=%c",
                wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsorted,
                isOrdered>=0 ? isOrdered+'0' : '?');
            sqlite3DebugPrintf("  was %s cost=%-3d,%3d,%3d order=%c\n",
                wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
                pTo->rUnsorted, pTo->isOrdered>=0 ? pTo->isOrdered+'0' : '?');
          }
#endif
        }
        /* pWLoop is a winner.  Add it to the set of best so far */
        pTo->maskLoop = pFrom->maskLoop | pWLoop->maskSelf;
        pTo->revLoop = revMask;
        pTo->nRow = nOut;
        pTo->rCost = rCost;
        pTo->rUnsorted = rUnsorted;
        pTo->isOrdered = isOrdered;
        memcpy(pTo->aLoop, pFrom->aLoop, sizeof(WhereLoop*)*iLoop);
        pTo->aLoop[iLoop] = pWLoop;
        if( nTo>=mxChoice ){
          mxI = 0;
          mxCost = aTo[0].rCost;
          mxUnsorted = aTo[0].nRow;
          for(jj=1, pTo=&aTo[1]; jj<mxChoice; jj++, pTo++){
            if( pTo->rCost>mxCost
             || (pTo->rCost==mxCost && pTo->rUnsorted>mxUnsorted)
            ){
              mxCost = pTo->rCost;
              mxUnsorted = pTo->rUnsorted;
              mxI = jj;
            }
          }
        }
      }
    }

#ifdef WHERETRACE_ENABLED  /* >=2 */
    if( sqlite3WhereTrace & 0x02 ){
      sqlite3DebugPrintf("---- after round %d ----\n", iLoop);
      for(ii=0, pTo=aTo; ii<nTo; ii++, pTo++){
        sqlite3DebugPrintf(" %s cost=%-3d nrow=%-3d order=%c",
           wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
           pTo->isOrdered>=0 ? (pTo->isOrdered+'0') : '?');
        if( pTo->isOrdered>0 ){
          sqlite3DebugPrintf(" rev=0x%llx\n", pTo->revLoop);
        }else{
          sqlite3DebugPrintf("\n");
        }
      }
    }
#endif

    /* Swap the roles of aFrom and aTo for the next generation */
    pFrom = aTo;
    aTo = aFrom;
    aFrom = pFrom;
    nFrom = nTo;
  }

  if( nFrom==0 ){
    sqlite3ErrorMsg(pParse, "no query solution");
    sqlite3StackFreeNN(pParse->db, pSpace);
    return SQLITE_ERROR;
  }

  /* Find the lowest cost path.  pFrom will be left pointing to that path */
  pFrom = aFrom;
  for(ii=1; ii<nFrom; ii++){
    if( pFrom->rCost>aFrom[ii].rCost ) pFrom = &aFrom[ii];
  }
  assert( pWInfo->nLevel==nLoop );
  /* Load the lowest cost path into pWInfo */
  for(iLoop=0; iLoop<nLoop; iLoop++){
    WhereLevel *pLevel = pWInfo->a + iLoop;
    pLevel->pWLoop = pWLoop = pFrom->aLoop[iLoop];
    pLevel->iFrom = pWLoop->iTab;
    pLevel->iTabCur = pWInfo->pTabList->a[pLevel->iFrom].iCursor;
  }
  if( (pWInfo->wctrlFlags & WHERE_WANT_DISTINCT)!=0
   && (pWInfo->wctrlFlags & WHERE_DISTINCTBY)==0
   && pWInfo->eDistinct==WHERE_DISTINCT_NOOP
   && nRowEst
  ){
    Bitmask notUsed;
    int rc = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pResultSet, pFrom,
                 WHERE_DISTINCTBY, nLoop-1, pFrom->aLoop[nLoop-1], &notUsed);
    if( rc==pWInfo->pResultSet->nExpr ){
      pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
    }
  }
  pWInfo->bOrderedInnerLoop = 0;
  if( pWInfo->pOrderBy ){
    pWInfo->nOBSat = pFrom->isOrdered;
    if( pWInfo->wctrlFlags & WHERE_DISTINCTBY ){
      if( pFrom->isOrdered==pWInfo->pOrderBy->nExpr ){
        pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
      }
    }else{
      pWInfo->revMask = pFrom->revLoop;
      if( pWInfo->nOBSat<=0 ){
        pWInfo->nOBSat = 0;
        if( nLoop>0 ){
          u32 wsFlags = pFrom->aLoop[nLoop-1]->wsFlags;
          if( (wsFlags & WHERE_ONEROW)==0
           && (wsFlags&(WHERE_IPK|WHERE_COLUMN_IN))!=(WHERE_IPK|WHERE_COLUMN_IN)
          ){
            Bitmask m = 0;
            int rc = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pOrderBy, pFrom,
                      WHERE_ORDERBY_LIMIT, nLoop-1, pFrom->aLoop[nLoop-1], &m);
            testcase( wsFlags & WHERE_IPK );
            testcase( wsFlags & WHERE_COLUMN_IN );
            if( rc==pWInfo->pOrderBy->nExpr ){
              pWInfo->bOrderedInnerLoop = 1;
              pWInfo->revMask = m;
            }
          }
        }
      }else if( nLoop
            && pWInfo->nOBSat==1
            && (pWInfo->wctrlFlags & (WHERE_ORDERBY_MIN|WHERE_ORDERBY_MAX))!=0
            ){
        pWInfo->bOrderedInnerLoop = 1;
      }
    }
    if( (pWInfo->wctrlFlags & WHERE_SORTBYGROUP)
        && pWInfo->nOBSat==pWInfo->pOrderBy->nExpr && nLoop>0
    ){
      Bitmask revMask = 0;
      int nOrder = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pOrderBy,
          pFrom, 0, nLoop-1, pFrom->aLoop[nLoop-1], &revMask
      );
      assert( pWInfo->sorted==0 );
      if( nOrder==pWInfo->pOrderBy->nExpr ){
        pWInfo->sorted = 1;
        pWInfo->revMask = revMask;
      }
    }
  }


  pWInfo->nRowOut = pFrom->nRow;

  /* Free temporary memory and return success */
  sqlite3StackFreeNN(pParse->db, pSpace);
  return SQLITE_OK;
}